

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O3

void __thiscall deqp::gles31::Functional::FboTestCase::checkError(FboTestCase *this)

{
  deUint32 error;
  Error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  code *local_38;
  deUint32 local_30;
  
  error = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper);
  if (error == 0) {
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got ","");
  local_38 = glu::getErrorName;
  local_30 = error;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_38);
  std::operator+(&local_58,&local_98,&local_78);
  glu::Error::Error(this_00,error,local_58._M_dataplus._M_p,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestCase.cpp"
                    ,0x98);
  __cxa_throw(this_00,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

void FboTestCase::checkError (void)
{
	deUint32 err = glGetError();
	if (err != GL_NO_ERROR)
		throw glu::Error((int)err, (string("Got ") + glu::getErrorStr(err).toString()).c_str(), DE_NULL, __FILE__, __LINE__);
}